

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

int t2_encode_packet(opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,uchar *dest,
                    int length,opj_codestream_info_t *cstr_info,int tileno)

{
  int value;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  opj_bio_t *bio_00;
  int *piVar9;
  uchar *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double *in_R9;
  opj_bio_t *unaff_retaddr;
  int in_stack_00000008;
  opj_packet_info_t *info_PK_1;
  opj_tcd_layer_t *layer_2;
  opj_tcd_cblk_enc_t *cblk_3;
  opj_tcd_precinct_t *prc_2;
  opj_tcd_band_t *band_2;
  opj_packet_info_t *info_PK;
  opj_tcd_pass_t *pass_1;
  opj_tcd_pass_t *pass;
  int passno;
  int len;
  int nump;
  int increment;
  opj_tcd_layer_t *layer_1;
  opj_tcd_cblk_enc_t *cblk_2;
  opj_tcd_layer_t *layer;
  opj_tcd_cblk_enc_t *cblk_1;
  opj_tcd_precinct_t *prc_1;
  opj_tcd_band_t *band_1;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_bio_t *bio;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  int layno;
  int precno;
  int resno;
  int compno;
  uchar *c;
  int cblkno;
  int bandno;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  opj_bio_t *in_stack_fffffffffffffee0;
  uint local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  uchar *local_48;
  OPJ_UINT32 local_40;
  int local_3c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar10;
  
  iVar10 = *(int *)(in_RDX + 0x28);
  value = *(int *)(in_RDX + 0x2c);
  lVar5 = *(long *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDX + 0x20) * 0x30 + 0x18) +
          (long)*(int *)(in_RDX + 0x24) * 0x98;
  local_48 = in_RCX;
  if ((*(uint *)(in_RSI + 4) & 2) != 0) {
    *in_RCX = 0xff;
    in_RCX[1] = 0x91;
    in_RCX[2] = '\0';
    in_RCX[3] = '\x04';
    uVar1 = (long)*(int *)(in_RDI + 0x350) % 0x10000;
    in_RCX[4] = (uchar)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                       0x100);
    uVar1 = (long)*(int *)(in_RDI + 0x350) % 0x10000;
    in_RCX[5] = (uchar)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                       0x100);
    local_48 = in_RCX + 6;
  }
  if (value == 0) {
    for (local_3c = 0; local_3c < *(int *)(lVar5 + 0x18); local_3c = local_3c + 1) {
      lVar6 = lVar5 + 0x20 + (long)local_3c * 0x28;
      lVar7 = *(long *)(lVar6 + 0x18) + (long)iVar10 * 0x30;
      tgt_reset(*(opj_tgt_tree_t **)(lVar7 + 0x20));
      tgt_reset(*(opj_tgt_tree_t **)(lVar7 + 0x28));
      for (local_40 = 0; (int)local_40 < *(int *)(lVar7 + 0x10) * *(int *)(lVar7 + 0x14);
          local_40 = local_40 + 1) {
        lVar8 = *(long *)(lVar7 + 0x18) + (long)(int)local_40 * 0x40;
        *(undefined4 *)(lVar8 + 0x30) = 0;
        tgt_setvalue(*(opj_tgt_tree_t **)(lVar7 + 0x28),local_40,
                     *(int *)(lVar6 + 0x20) - *(int *)(lVar8 + 0x28));
      }
    }
  }
  bio_00 = bio_create();
  bio_init_enc(bio_00,local_48,in_R8D);
  bio_write(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  for (local_3c = 0; local_3c < *(int *)(lVar5 + 0x18); local_3c = local_3c + 1) {
    lVar6 = *(long *)(lVar5 + (long)local_3c * 0x28 + 0x38) + (long)iVar10 * 0x30;
    for (local_40 = 0; (int)local_40 < *(int *)(lVar6 + 0x10) * *(int *)(lVar6 + 0x14);
        local_40 = local_40 + 1) {
      lVar7 = *(long *)(lVar6 + 0x18) + (long)(int)local_40 * 0x40;
      if ((*(int *)(lVar7 + 0x30) == 0) &&
         (*(int *)(*(long *)(lVar7 + 8) + (long)value * 0x18) != 0)) {
        tgt_setvalue(*(opj_tgt_tree_t **)(lVar6 + 0x20),local_40,value);
      }
    }
    for (local_40 = 0; (int)local_40 < *(int *)(lVar6 + 0x10) * *(int *)(lVar6 + 0x14);
        local_40 = local_40 + 1) {
      lVar7 = *(long *)(lVar6 + 0x18) + (long)(int)local_40 * 0x40;
      piVar9 = (int *)(*(long *)(lVar7 + 8) + (long)value * 0x18);
      local_bc = 0;
      local_c0 = 0;
      local_c4 = 0;
      if (*(int *)(lVar7 + 0x30) == 0) {
        tgt_encode(unaff_retaddr,
                   (opj_tgt_tree_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (OPJ_UINT32)((ulong)in_RDI >> 0x20),(OPJ_INT32)in_RDI);
      }
      else {
        bio_write(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      }
      if (*piVar9 != 0) {
        if (*(int *)(lVar7 + 0x30) == 0) {
          *(undefined4 *)(lVar7 + 0x2c) = 3;
          tgt_encode(unaff_retaddr,
                     (opj_tgt_tree_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                     ,(OPJ_UINT32)((ulong)in_RDI >> 0x20),(OPJ_INT32)in_RDI);
        }
        t2_putnumpasses(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        for (local_c8 = *(uint *)(lVar7 + 0x30); local_c8 < (uint)(*(int *)(lVar7 + 0x30) + *piVar9)
            ; local_c8 = local_c8 + 1) {
          lVar8 = *(long *)(lVar7 + 0x10) + (long)(int)local_c8 * 0x18;
          local_c0 = local_c0 + 1;
          local_c4 = *(int *)(lVar8 + 0x14) + local_c4;
          if ((*(int *)(lVar8 + 0x10) != 0) || (local_c8 == (*(int *)(lVar7 + 0x30) + *piVar9) - 1U)
             ) {
            iVar2 = int_floorlog2(local_c4);
            iVar4 = *(int *)(lVar7 + 0x2c);
            iVar3 = int_floorlog2(local_c0);
            local_bc = int_max(local_bc,(iVar2 + 1) - (iVar4 + iVar3));
            local_c4 = 0;
            local_c0 = 0;
          }
        }
        t2_putcommacode(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        *(int *)(lVar7 + 0x2c) = local_bc + *(int *)(lVar7 + 0x2c);
        for (local_c8 = *(uint *)(lVar7 + 0x30); local_c8 < (uint)(*(int *)(lVar7 + 0x30) + *piVar9)
            ; local_c8 = local_c8 + 1) {
          local_c0 = local_c0 + 1;
          if ((*(int *)(*(long *)(lVar7 + 0x10) + (long)(int)local_c8 * 0x18 + 0x10) != 0) ||
             (local_c8 == (*(int *)(lVar7 + 0x30) + *piVar9) - 1U)) {
            in_stack_fffffffffffffedc = *(int *)(lVar7 + 0x2c);
            in_stack_fffffffffffffee0 = bio_00;
            int_floorlog2(local_c0);
            bio_write(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
            ;
            local_c0 = 0;
          }
        }
      }
    }
  }
  iVar4 = bio_flush((opj_bio_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (iVar4 == 0) {
    iVar4 = bio_numbytes(bio_00);
    local_48 = local_48 + iVar4;
    bio_destroy((opj_bio_t *)0x2de33f);
    if ((*(uint *)(in_RSI + 4) & 4) != 0) {
      *local_48 = 0xff;
      local_48[1] = 0x92;
      local_48 = local_48 + 2;
    }
    if ((in_R9 != (double *)0x0) && (*(int *)((long)in_R9 + 0xc) != 0)) {
      *(long *)(*(long *)((long)in_R9[0xd] + (long)in_stack_00000008 * 0x260 + 0x228) +
                (long)*(int *)(in_R9 + 1) * 0x20 + 8) = (long)((int)local_48 - (int)in_RCX);
    }
    for (local_3c = 0; local_3c < *(int *)(lVar5 + 0x18); local_3c = local_3c + 1) {
      lVar6 = *(long *)(lVar5 + (long)local_3c * 0x28 + 0x38) + (long)iVar10 * 0x30;
      for (local_40 = 0; (int)local_40 < *(int *)(lVar6 + 0x10) * *(int *)(lVar6 + 0x14);
          local_40 = local_40 + 1) {
        lVar7 = *(long *)(lVar6 + 0x18) + (long)(int)local_40 * 0x40;
        piVar9 = (int *)(*(long *)(lVar7 + 8) + (long)value * 0x18);
        if (*piVar9 != 0) {
          if (in_RCX + in_R8D < local_48 + (uint)piVar9[1]) {
            return -999;
          }
          memcpy(local_48,*(void **)(piVar9 + 4),(ulong)(uint)piVar9[1]);
          *(int *)(lVar7 + 0x30) = *piVar9 + *(int *)(lVar7 + 0x30);
          local_48 = local_48 + (uint)piVar9[1];
          if ((in_R9 != (double *)0x0) && (*(int *)((long)in_R9 + 0xc) != 0)) {
            lVar7 = *(long *)((long)in_R9[0xd] + (long)in_stack_00000008 * 0x260 + 0x228) +
                    (long)*(int *)(in_R9 + 1) * 0x20;
            *(double *)(lVar7 + 0x18) = *(double *)(piVar9 + 2) + *(double *)(lVar7 + 0x18);
            if (*in_R9 < *(double *)(lVar7 + 0x18)) {
              *in_R9 = *(double *)(lVar7 + 0x18);
            }
          }
        }
      }
    }
    iVar10 = (int)local_48 - (int)in_RCX;
  }
  else {
    bio_destroy((opj_bio_t *)0x2de2fd);
    iVar10 = -999;
  }
  return iVar10;
}

Assistant:

static int t2_encode_packet(opj_tcd_tile_t * tile, opj_tcp_t * tcp, opj_pi_iterator_t *pi, unsigned char *dest, int length, opj_codestream_info_t *cstr_info, int tileno) {
	int bandno, cblkno;
	unsigned char *c = dest;

	int compno = pi->compno;	/* component value */
	int resno  = pi->resno;		/* resolution level value */
	int precno = pi->precno;	/* precinct value */
	int layno  = pi->layno;		/* quality layer value */

	opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
	opj_tcd_resolution_t *res = &tilec->resolutions[resno];
	
	opj_bio_t *bio = NULL;	/* BIO component */
	
	/* <SOP 0xff91> */
	if (tcp->csty & J2K_CP_CSTY_SOP) {
		c[0] = 255;
		c[1] = 145;
		c[2] = 0;
		c[3] = 4;
		c[4] = (unsigned char)((tile->packno % 65536) / 256);
		c[5] = (unsigned char)((tile->packno % 65536) % 256);
		c += 6;
	}
	/* </SOP> */
	
	if (!layno) {
		for (bandno = 0; bandno < res->numbands; bandno++) {
			opj_tcd_band_t *band = &res->bands[bandno];
			opj_tcd_precinct_t *prc = &band->precincts[precno];
			tgt_reset(prc->incltree);
			tgt_reset(prc->imsbtree);
			for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
				opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
				cblk->numpasses = 0;
				tgt_setvalue(prc->imsbtree, cblkno, band->numbps - cblk->numbps);
			}
		}
	}
	
	bio = bio_create();
	bio_init_enc(bio, c, length);
	bio_write(bio, 1, 1);		/* Empty header bit */
	
	/* Writing Packet header */
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!cblk->numpasses && layer->numpasses) {
				tgt_setvalue(prc->incltree, cblkno, layno);
			}
		}
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			int increment = 0;
			int nump = 0;
			int len = 0, passno;
			/* cblk inclusion bits */
			if (!cblk->numpasses) {
				tgt_encode(bio, prc->incltree, cblkno, layno + 1);
			} else {
				bio_write(bio, layer->numpasses != 0, 1);
			}
			/* if cblk not included, go to the next cblk  */
			if (!layer->numpasses) {
				continue;
			}
			/* if first instance of cblk --> zero bit-planes information */
			if (!cblk->numpasses) {
				cblk->numlenbits = 3;
				tgt_encode(bio, prc->imsbtree, cblkno, 999);
			}
			/* number of coding passes included */
			t2_putnumpasses(bio, layer->numpasses);
			
			/* computation of the increase of the length indicator and insertion in the header     */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					increment = int_max(increment, int_floorlog2(len) + 1 - (cblk->numlenbits + int_floorlog2(nump)));
					len = 0;
					nump = 0;
				}
			}
			t2_putcommacode(bio, increment);

			/* computation of the new Length indicator */
			cblk->numlenbits += increment;

			/* insertion of the codeword segment length */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					bio_write(bio, len, cblk->numlenbits + int_floorlog2(nump));
					len = 0;
					nump = 0;
				}
			}
		}
	}

	if (bio_flush(bio)) {
		bio_destroy(bio);
		return -999;		/* modified to eliminate longjmp !! */
	}

	c += bio_numbytes(bio);
	bio_destroy(bio);
	
	/* <EPH 0xff92> */
	if (tcp->csty & J2K_CP_CSTY_EPH) {
		c[0] = 255;
		c[1] = 146;
		c += 2;
	}
	/* </EPH> */

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	// Will be updated later by incrementing with packet start value */
	if(cstr_info && cstr_info->index_write) {
		opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
		info_PK->end_ph_pos = (int)(c - dest);
	}
	/* INDEX >> */
	
	/* Writing the packet body */
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!layer->numpasses) {
				continue;
			}
			if (c + layer->len > dest + length) {
				return -999;
			}
			
			memcpy(c, layer->data, layer->len);
			cblk->numpasses += layer->numpasses;
			c += layer->len;
			/* << INDEX */ 
			if(cstr_info && cstr_info->index_write) {
				opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
				info_PK->disto += layer->disto;
				if (cstr_info->D_max < info_PK->disto) {
					cstr_info->D_max = info_PK->disto;
				}
			}
			/* INDEX >> */
		}
	}
	
	return (c - dest);
}